

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

bool __thiscall board::Board::sqAttacked(Board *this,int square,int side)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  int i;
  long lVar5;
  
  if (side == 0) {
    if ((this->board[(long)square + -0xb] == 1) || (this->board[(long)square + -9] == 1)) {
      return true;
    }
  }
  else if (side == 1) {
    if (this->board[(long)square + 0xb] == 7) {
      return true;
    }
    bVar3 = true;
    if (this->board[(long)square + 9] == 7) {
      return true;
    }
    goto LAB_0012394b;
  }
  bVar3 = false;
LAB_0012394b:
  lVar5 = 0;
  while (lVar5 != 8) {
    piVar4 = MOVE_DIR[2] + lVar5;
    if ((this->board[(long)*piVar4 + (long)square] == 2 && side == 0) ||
       (lVar5 = lVar5 + 1, (bool)(this->board[(long)*piVar4 + (long)square] == 8 & bVar3))) {
      return true;
    }
  }
  lVar5 = 0;
  do {
    if (lVar5 == 4) {
      lVar5 = 0;
      do {
        if (lVar5 == 4) {
          lVar5 = 0;
          while( true ) {
            bVar2 = lVar5 != 8;
            if (lVar5 == 8) {
              return bVar2;
            }
            piVar4 = MOVE_DIR[6] + lVar5;
            if (this->board[(long)*piVar4 + (long)square] == 6 && side == 0) break;
            lVar5 = lVar5 + 1;
            if ((bool)(this->board[(long)*piVar4 + (long)square] == 0xc & bVar3)) {
              return bVar2;
            }
          }
          return bVar2;
        }
        for (piVar4 = this->board + (MOVE_DIR[3][lVar5] + square); uVar1 = *piVar4, uVar1 == 0;
            piVar4 = piVar4 + MOVE_DIR[3][lVar5]) {
        }
        if (uVar1 != 99) {
          if (side == 0) {
            if (uVar1 == 3) {
              return true;
            }
            if (uVar1 == 5) {
              return true;
            }
          }
          if ((bVar3) && ((uVar1 | 2) == 0xb)) {
            return true;
          }
        }
        lVar5 = lVar5 + 1;
      } while( true );
    }
    for (piVar4 = this->board + (MOVE_DIR[4][lVar5] + square); uVar1 = *piVar4, uVar1 == 0;
        piVar4 = piVar4 + MOVE_DIR[4][lVar5]) {
    }
    if (uVar1 != 99) {
      if ((uVar1 & 0xfffffffe) == 4 && side == 0) {
        return true;
      }
      if ((bool)((uVar1 & 0xfffffffe) == 10 & bVar3)) {
        return true;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

bool board::Board::sqAttacked(const int square, const int side) const
{
    int targetSquare;
    int piece;
    if (side == WHITE && (board[square - 11] == WP || board[square - 9] == WP)) {
        return true;
    }
    if (side == BLACK && (board[square + 11] == BP || board[square + 9] == BP)) {
        return true;
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WN][i]];
        if (side == WHITE && piece == WN) {
            return true;
        }
        if (side == BLACK && piece == BN) {
            return true;
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WR][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WR || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BR || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WR][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WB][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WB || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BB || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WB][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WK][i]];
        if ((side == WHITE && piece == WK) || (side == BLACK && piece == BK)) {
            return true;
        }
    }
    return false;
}